

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_ClassArray<ON_MappingRef> *a)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ON__INT32 local_34;
  
  iVar1 = a->m_count;
  uVar3 = 1;
  bVar2 = WriteInt32(this,1,&local_34);
  if (bVar2 && 0 < (long)iVar1) {
    lVar4 = 0;
    do {
      bVar2 = ON_MappingRef::Write((ON_MappingRef *)((a->m_a->m_plugin_id).Data4 + lVar4 + -8),this)
      ;
      if ((ulong)(long)iVar1 <= uVar3) {
        return bVar2;
      }
      lVar4 = lVar4 + 0x28;
      uVar3 = uVar3 + 1;
    } while (bVar2);
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::WriteArray( const ON_ClassArray<ON_MappingRef>& a )
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    // ON_MappingRef::Write() puts the element in a chunk
    rc = a[i].Write(*this);
  }
  return rc;
}